

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O0

Matrix33d * gmath::createR(double ax,double ay,double az)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  Matrix33d *ret;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  dVar2 = cos(in_XMM1_Qa);
  dVar3 = cos(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,0);
  *pdVar1 = dVar2 * dVar3;
  dVar2 = cos(in_XMM1_Qa);
  dVar3 = sin(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,1);
  *pdVar1 = -dVar2 * dVar3;
  dVar2 = sin(in_XMM1_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,0,2);
  *pdVar1 = -dVar2;
  dVar2 = sin(in_XMM0_Qa);
  dVar3 = sin(in_XMM1_Qa);
  dVar4 = cos(in_XMM2_Qa);
  dVar5 = cos(in_XMM0_Qa);
  dVar6 = sin(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,0);
  *pdVar1 = -dVar2 * dVar3 * dVar4 + dVar5 * dVar6;
  dVar2 = sin(in_XMM0_Qa);
  dVar3 = sin(in_XMM1_Qa);
  dVar4 = sin(in_XMM2_Qa);
  dVar5 = cos(in_XMM0_Qa);
  dVar6 = cos(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,1);
  *pdVar1 = dVar2 * dVar3 * dVar4 + dVar5 * dVar6;
  dVar2 = sin(in_XMM0_Qa);
  dVar3 = cos(in_XMM1_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,1,2);
  *pdVar1 = -dVar2 * dVar3;
  dVar2 = cos(in_XMM0_Qa);
  dVar3 = sin(in_XMM1_Qa);
  dVar4 = cos(in_XMM2_Qa);
  dVar5 = sin(in_XMM0_Qa);
  dVar6 = sin(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,0);
  *pdVar1 = dVar2 * dVar3 * dVar4 + dVar5 * dVar6;
  dVar2 = cos(in_XMM0_Qa);
  dVar3 = sin(in_XMM1_Qa);
  dVar4 = sin(in_XMM2_Qa);
  dVar5 = sin(in_XMM0_Qa);
  dVar6 = cos(in_XMM2_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,1);
  *pdVar1 = -dVar2 * dVar3 * dVar4 + dVar5 * dVar6;
  dVar2 = cos(in_XMM0_Qa);
  dVar3 = cos(in_XMM1_Qa);
  pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,2,2);
  *pdVar1 = dVar2 * dVar3;
  return in_RDI;
}

Assistant:

Matrix33d createR(double ax, double ay, double az)
{
  Matrix33d ret;

  ret(0, 0)=cos(ay)*cos(az);
  ret(0, 1)=-cos(ay)*sin(az);
  ret(0, 2)=-sin(ay);

  ret(1, 0)=-sin(ax)*sin(ay)*cos(az)+cos(ax)*sin(az);
  ret(1, 1)=sin(ax)*sin(ay)*sin(az)+cos(ax)*cos(az);
  ret(1, 2)=-sin(ax)*cos(ay);

  ret(2, 0)=cos(ax)*sin(ay)*cos(az)+sin(ax)*sin(az);
  ret(2, 1)=-cos(ax)*sin(ay)*sin(az)+sin(ax)*cos(az);
  ret(2, 2)=cos(ax)*cos(ay);

  return ret;
}